

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool IsMemoryLoadOfVariable(VmInstruction *instruction,VariableData *variable)

{
  VmValue **ppVVar1;
  VmValue *pVVar2;
  byte bVar3;
  
  if (instruction->cmd < VM_INST_LOAD_IMMEDIATE) {
    if ((instruction->arguments).count == 0) goto LAB_001b9cac;
    ppVVar1 = (instruction->arguments).data;
    pVVar2 = *ppVVar1;
    if ((pVVar2 == (VmValue *)0x0) || (pVVar2->typeID != 1)) {
      pVVar2 = (VmValue *)0x0;
    }
    if (pVVar2 != (VmValue *)0x0) {
      ppVVar1 = (VmValue **)(ulong)((VariableData *)pVVar2[1].comment.end == variable);
    }
    bVar3 = (byte)ppVVar1;
    if (pVVar2 != (VmValue *)0x0) goto LAB_001b9ca8;
  }
  if (instruction->cmd == VM_INST_MEM_COPY) {
    if ((instruction->arguments).count < 3) {
LAB_001b9cac:
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x199,
                    "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]");
    }
    pVVar2 = (instruction->arguments).data[2];
    if ((pVVar2 == (VmValue *)0x0) || (pVVar2->typeID != 1)) {
      pVVar2 = (VmValue *)0x0;
    }
    if (pVVar2 != (VmValue *)0x0) {
      bVar3 = (VariableData *)pVVar2[1].comment.end == variable;
      goto LAB_001b9ca8;
    }
  }
  bVar3 = 0;
LAB_001b9ca8:
  return (bool)(bVar3 & 1);
}

Assistant:

bool IsMemoryLoadOfVariable(VmInstruction *instruction, VariableData *variable)
{
	if(instruction->cmd >= VM_INST_LOAD_BYTE && instruction->cmd <= VM_INST_LOAD_STRUCT)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[0]))
			return constant->container == variable;
	}

	if(instruction->cmd == VM_INST_MEM_COPY)
	{
		if(VmConstant *constant = getType<VmConstant>(instruction->arguments[2]))
			return constant->container == variable;
	}

	return false;
}